

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O3

void CLOSE_BRACKET_WITHOUT_ESC_WARN(ParseEnv *env,OnigUChar *c)

{
  OnigUChar buf [256];
  OnigUChar local_108 [256];
  
  if ((onig_warn != onig_null_warn) && ((env->syntax->behavior & 0x1000000) != 0)) {
    onig_snprintf_with_pattern
              (local_108,0x100,env->enc,env->pattern,env->pattern_end,
               "regular expression has \'%s\' without escape","]");
    (*onig_warn)((char *)local_108);
  }
  return;
}

Assistant:

static void
CLOSE_BRACKET_WITHOUT_ESC_WARN(ParseEnv* env, UChar* c)
{
  if (onig_warn == onig_null_warn) return ;

  if (IS_SYNTAX_BV((env)->syntax, ONIG_SYN_WARN_CC_OP_NOT_ESCAPED)) {
    UChar buf[WARN_BUFSIZE];
    onig_snprintf_with_pattern(buf, WARN_BUFSIZE, (env)->enc,
                         (env)->pattern, (env)->pattern_end,
                         "regular expression has '%s' without escape", c);
    (*onig_warn)((char* )buf);
  }
}